

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderLibraryCase.cpp
# Opt level: O2

int __thiscall deqp::gls::ShaderLibraryCase::init(ShaderLibraryCase *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  ContextInfo *pCVar2;
  pointer pRVar3;
  bool bVar4;
  ContextType type;
  int iVar5;
  NotSupportedError *this_00;
  char *__s;
  ulong uVar6;
  undefined1 auVar7 [16];
  int supportedValue;
  int requiredValue;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  string local_258;
  string local_238;
  string local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  code *local_1b8;
  uint local_1b0;
  MessageBuilder local_1a8;
  
  type.super_ApiType.m_bits = (ApiType)(*this->m_renderCtx->_vptr_RenderContext[2])();
  bVar4 = glu::isGLSLVersionSupported(type,(this->m_spec).targetVersion);
  if (!bVar4) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    __s = glu::getGLSLVersionName((this->m_spec).targetVersion);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_298,__s,(allocator<char> *)&local_278);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1a8,
                   &local_298," is not supported");
    tcu::NotSupportedError::NotSupportedError
              (this_00,(char *)local_1a8.m_log,(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsShaderLibraryCase.cpp"
               ,0x2dc);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  pCVar2 = this->m_contextInfo;
  for (uVar6 = 0;
      pRVar3 = (this->m_spec).requiredCaps.
               super__Vector_base<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar6 < (ulong)((long)(this->m_spec).requiredCaps.
                            super__Vector_base<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar3 >> 3);
      uVar6 = uVar6 + 1) {
    uVar1 = pRVar3[uVar6].enumName;
    iVar5 = pRVar3[uVar6].referenceValue;
    requiredValue = iVar5;
    supportedValue = (*pCVar2->_vptr_ContextInfo[2])(pCVar2,(ulong)uVar1);
    if (supportedValue <= iVar5) {
      auVar7 = __cxa_allocate_exception(0x38);
      local_1b8 = glu::getGettableStateName;
      local_1b0 = uVar1;
      de::toString<tcu::Format::Enum<int,2ul>>(&local_218,(de *)&local_1b8,auVar7._8_8_);
      std::operator+(&local_1f8,"Test requires ",&local_218);
      std::operator+(&local_1d8,&local_1f8," (");
      de::toString<int>(&local_238,&supportedValue);
      std::operator+(&local_278,&local_1d8,&local_238);
      std::operator+(&local_298,&local_278,") >= ");
      de::toString<int>(&local_258,&requiredValue);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1a8
                     ,&local_298,&local_258);
      tcu::NotSupportedError::NotSupportedError(auVar7._0_8_,(string *)&local_1a8);
      __cxa_throw(auVar7._0_8_,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  iVar5 = (this->m_spec).expectResult - EXPECT_COMPILE_FAIL;
  switch(iVar5) {
  case 0:
    local_1a8.m_log = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8.m_str);
    std::operator<<((ostream *)&local_1a8.m_str,"Expecting shader compilation to fail.");
    tcu::MessageBuilder::operator<<(&local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    break;
  case 1:
    local_1a8.m_log = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8.m_str);
    std::operator<<((ostream *)&local_1a8.m_str,"Expecting program linking to fail.");
    tcu::MessageBuilder::operator<<(&local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    break;
  case 2:
    local_1a8.m_log = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8.m_str);
    std::operator<<((ostream *)&local_1a8.m_str,
                    "Expecting either shader compilation or program linking to fail.");
    tcu::MessageBuilder::operator<<(&local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    break;
  case 3:
    local_1a8.m_log = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8.m_str);
    std::operator<<((ostream *)&local_1a8.m_str,"Expecting program validation to fail.");
    tcu::MessageBuilder::operator<<(&local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    break;
  case 4:
    local_1a8.m_log = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8.m_str);
    std::operator<<((ostream *)&local_1a8.m_str,
                    "Expecting shader compilation and program linking to succeed. Resulting program will not be executed."
                   );
    tcu::MessageBuilder::operator<<(&local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    break;
  default:
    goto switchD_006b74f2_default;
  }
  iVar5 = std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8.m_str);
switchD_006b74f2_default:
  return iVar5;
}

Assistant:

void ShaderLibraryCase::init (void)
{
	DE_ASSERT(isValid(m_spec));

	if (!isGLSLVersionSupported(m_renderCtx.getType(), m_spec.targetVersion))
		TCU_THROW(NotSupportedError, (string(getGLSLVersionName(m_spec.targetVersion)) + " is not supported").c_str());

	checkImplementationLimits(m_spec.requiredCaps, m_contextInfo);

	// log the expected result
	switch (m_spec.expectResult)
	{
		case EXPECT_PASS:
			// Don't write anything
			break;

		case EXPECT_COMPILE_FAIL:
			m_testCtx.getLog() << tcu::TestLog::Message << "Expecting shader compilation to fail." << tcu::TestLog::EndMessage;
			break;

		case EXPECT_LINK_FAIL:
			m_testCtx.getLog() << tcu::TestLog::Message << "Expecting program linking to fail." << tcu::TestLog::EndMessage;
			break;

		case EXPECT_COMPILE_LINK_FAIL:
			m_testCtx.getLog() << tcu::TestLog::Message << "Expecting either shader compilation or program linking to fail." << tcu::TestLog::EndMessage;
			break;

		case EXPECT_VALIDATION_FAIL:
			m_testCtx.getLog() << tcu::TestLog::Message << "Expecting program validation to fail." << tcu::TestLog::EndMessage;
			break;

		case EXPECT_BUILD_SUCCESSFUL:
			m_testCtx.getLog() << tcu::TestLog::Message << "Expecting shader compilation and program linking to succeed. Resulting program will not be executed." << tcu::TestLog::EndMessage;
			break;

		default:
			DE_ASSERT(false);
			break;
	}
}